

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eodata.cpp
# Opt level: O0

void read_pub_files<ESF>(ESF *pub,string *filename,bool auto_split)

{
  uchar b1;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  FILE *__stream;
  undefined8 uVar4;
  size_t sVar5;
  pointer pvVar6;
  pointer pvVar7;
  reference pvVar8;
  reference file;
  size_type sVar9;
  reference pvVar10;
  Pub_File *pub_file;
  value_type local_1b8;
  uint local_17c;
  uint local_178;
  int version;
  int numobj;
  int readobj;
  undefined1 uStack_167;
  char header_buf [10];
  FILE *fh;
  char local_148 [4];
  int file_number;
  char fn_buf [256];
  undefined1 local_40 [8];
  string filename_template;
  bool auto_split_local;
  string *filename_local;
  ESF *pub_local;
  
  filename_template.field_2._M_local_buf[0xf] = auto_split;
  std::vector<Pub_File,_std::allocator<Pub_File>_>::clear(&pub->files);
  std::vector<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_>::clear(&pub->data);
  convert_pub_filename((string *)local_40,filename);
  fh._4_4_ = 1;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  snprintf(local_148,0x100,pcVar3,1);
  __stream = fopen(local_148,"rb");
  eodata_safe_fail_filename = (char *)std::__cxx11::string::c_str();
  if (__stream == (FILE *)0x0) {
    uVar4 = std::__cxx11::string::c_str();
    Console::Err("Could not load file: %s",uVar4);
    exit(1);
  }
  sVar5 = fread((void *)((long)&numobj + 2),1,10,__stream);
  if (sVar5 != 10) {
    fclose(__stream);
    eodata_safe_fail(0x127);
  }
  pvVar6 = std::array<unsigned_char,_4UL>::data(&pub->rid);
  *(undefined4 *)pvVar6 = stack0xfffffffffffffe95;
  pvVar7 = std::array<unsigned_char,_2UL>::data(&pub->len);
  *(undefined2 *)pvVar7 = _uStack_167;
  version = 0;
  pvVar8 = std::array<unsigned_char,_2UL>::operator[](&pub->len,0);
  b1 = *pvVar8;
  pvVar8 = std::array<unsigned_char,_2UL>::operator[](&pub->len,1);
  local_178 = PacketProcessor::Number(b1,*pvVar8,0xfe,0xfe);
  local_17c = PacketProcessor::Number(header_buf[1],0xfe,0xfe,0xfe);
  std::vector<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_>::resize
            (&pub->data,(long)(int)(local_178 + 1));
  do {
    if ((int)local_178 <= version || 999 < fh._4_4_) break;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    fh._4_4_ = fh._4_4_ + 1;
    snprintf(local_148,0x100,pcVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,local_148,(allocator<char> *)((long)&pub_file + 7));
    local_1b8.splits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b8.splits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1b8.splits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_1b8.splits);
    std::vector<Pub_File,_std::allocator<Pub_File>_>::push_back(&pub->files,&local_1b8);
    Pub_File::~Pub_File(&local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&pub_file + 7));
    file = std::vector<Pub_File,_std::allocator<Pub_File>_>::back(&pub->files);
    iVar2 = read_single_file<ESF>
                      (pub,file,(bool)(filename_template.field_2._M_local_buf[0xf] & 1),local_17c,
                       version + 1);
    version = iVar2 + version;
    sVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&file->splits);
  } while (sVar9 < 3);
  if ((int)local_17c < 1) {
    pvVar10 = std::vector<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_>::back
                        (&pub->data);
    bVar1 = std::operator==(&pvVar10->name,"eof");
    if (bVar1) {
      std::vector<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_>::pop_back(&pub->data);
    }
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void read_pub_files(T& pub, const std::string& filename, bool auto_split)
{
	pub.files.clear();
	pub.data.clear();

	std::string filename_template = convert_pub_filename(filename);
	char fn_buf[256];
	int file_number = 1;

	std::snprintf(fn_buf, sizeof fn_buf, filename_template.c_str(), file_number);

	std::FILE *fh = std::fopen(fn_buf, "rb");
	eodata_safe_fail_filename = filename.c_str();

	if (!fh)
	{
		Console::Err("Could not load file: %s", filename.c_str());
		std::exit(1);
	}

	char header_buf[10];
	SAFE_READ(header_buf, sizeof(char), 10, fh);

	std::memcpy(pub.rid.data(), header_buf + 3, 4);
	std::memcpy(pub.len.data(), header_buf + 7, 2);

	int readobj = 0;
	int numobj = PacketProcessor::Number(pub.len[0], pub.len[1]);
	int version = PacketProcessor::Number(header_buf[9]);

	pub.data.resize(numobj + 1);

	while (readobj < numobj && file_number < 1000)
	{
		std::snprintf(fn_buf, sizeof fn_buf, filename_template.c_str(), file_number++);
		pub.files.push_back(Pub_File{fn_buf, {}});
		Pub_File& pub_file = pub.files.back();
		readobj += read_single_file(pub, pub_file, auto_split, version, readobj + 1);

		// Only a single file is loaded if auto-splitting occurs
		if (pub_file.splits.size() > 2)
			break;
	}

	if (version < 1 && pub.data.back().name == "eof")
		pub.data.pop_back();
}